

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O1

void csp_id_prepend(csp_packet_t *packet)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  bVar1 = (packet->id).pri;
  uVar5 = (packet->id).dst;
  uVar6 = (packet->id).src;
  bVar2 = (packet->id).dport;
  bVar3 = (packet->id).sport;
  bVar4 = (packet->id).flags;
  if (csp_conf.version == '\x02') {
    uVar13 = (ulong)bVar2 << 0xc | (ulong)uVar6 << 0x12;
    uVar14 = uVar13 | (ulong)uVar5 << 0x20 | (ulong)bVar1 << 0x2e;
    uVar9 = (ulong)bVar3 << 6 | (ulong)bVar4;
    uVar10 = uVar9 | uVar14;
    (packet->field_0).field_1.frame_begin = packet->header + 2;
    uVar7 = packet->length;
    (packet->field_0).field_1.frame_length = uVar7 + 6;
    *(ushort *)(packet->header + 6) =
         (ushort)(uVar10 >> 8) & 0xff | (ushort)((uVar9 << 0x38) >> 0x30);
    *(uint *)(packet->header + 2) =
         ((uint)(uVar14 >> 0x20) & 0xff00) >> 8 | (uint)(uVar14 >> 0x18) & 0xff00 |
         (uint)(uVar10 >> 8) & 0xff0000 | (uint)(((uVar13 & 0xff0000) << 0x18) >> 0x10);
    return;
  }
  uVar11 = (uint)bVar2 << 0xe;
  uVar12 = uVar11 | (uint)uVar6 << 0x19 | (uint)uVar5 << 0x14 | (uint)bVar1 << 0x1e;
  (packet->field_0).field_1.frame_begin = packet->header + 4;
  uVar8 = packet->length;
  (packet->field_0).field_1.frame_length = uVar8 + 4;
  *(uint *)(packet->header + 4) =
       uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | ((uint)bVar3 << 8 | uVar11 & 0xff00) << 8 |
       (uint)bVar4 << 0x18;
  return;
}

Assistant:

void csp_id_prepend(csp_packet_t * packet) {
	if (csp_conf.version == 2) {
		csp_id2_prepend(packet);
	} else {
		csp_id1_prepend(packet);
	}
}